

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O3

longlong LDSketch_low_estimate(LDSketch_t *sk,uchar *key)

{
  uint uVar1;
  longlong lVar2;
  longlong lVar3;
  int iVar4;
  int row_no;
  
  row_no = 0;
  if (sk->h < 1) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = LDSketch_find(sk,key,0,sk->lgn + -1,row_no);
      iVar4 = sk->w * row_no + uVar1;
      lVar2 = dyn_tbl_low_estimate(sk->tbl[iVar4],key);
      if (lVar3 <= lVar2) {
        lVar3 = dyn_tbl_low_estimate(sk->tbl[iVar4],key);
      }
      row_no = row_no + 1;
    } while (row_no < sk->h);
  }
  return lVar3;
}

Assistant:

long long LDSketch_low_estimate(LDSketch_t* sk, unsigned char* key) {
	long long ret = 0;
	for (int i = 0; i < sk->h; ++i) {
		int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		int index = i * sk->w + k;
		ret = MAX(ret, dyn_tbl_low_estimate(sk->tbl[index], key));
	}
	return ret;
}